

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::GetIndexAction_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var pvVar2;
  RecyclableObject *pRVar3;
  Var aValue;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == GetIndexActionTag) {
    pvVar2 = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (pvVar2 != (Var)0x0) {
      BVar1 = Js::JavascriptOperators::IsObject(pvVar2);
      if (BVar1 != 0) {
        pRVar3 = Js::VarTo<Js::RecyclableObject>(pvVar2);
        if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          pvVar2 = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
        }
        aValue = InflateVarInReplay(executeContext,*(TTDVar *)(evt + 2));
        if (aValue != (Var)0x0) {
          if ((ulong)aValue >> 0x30 == 0) {
            pRVar3 = Js::VarTo<Js::RecyclableObject>(aValue);
            if ((((((pRVar3->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr != scriptContext) {
              aValue = Js::CrossSite::MarshalVar(scriptContext,pRVar3,false);
            }
          }
          pvVar2 = Js::JavascriptOperators::OP_GetElementI(pvVar2,aValue,scriptContext);
          JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<2ul>,(TTD::NSLogEvents::EventKind)52>
                    (executeContext,evt,pvVar2);
          return;
        }
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetIndexAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var index = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(index, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetElementI(var, index, ctx);

            JsRTActionHandleResultForReplay<JsRTDoubleVarArgumentAction, EventKind::GetIndexActionTag>(executeContext, evt, res);
        }